

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O3

Expression *
slang::ast::CallExpression::fromSystemMethod
          (Compilation *compilation,Expression *expr,MemberSelector *selector,
          InvocationExpressionSyntax *syntax,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  Type *this;
  Type *pTVar1;
  Compilation *compilation_00;
  Diagnostic *pDVar2;
  Expression *pEVar3;
  SourceRange SVar4;
  Scope *in_stack_ffffffffffffffb0;
  SourceLocation local_40;
  SourceLocation SStack_38;
  
  this = (expr->type).ptr;
  pTVar1 = this->canonical;
  if (pTVar1 == (Type *)0x0) {
    Type::resolveCanonical(this);
    pTVar1 = this->canonical;
  }
  compilation_00 =
       (Compilation *)
       Compilation::getSystemMethod(compilation,(pTVar1->super_Symbol).kind,selector->name);
  if (compilation_00 != (Compilation *)0x0) {
    if (syntax == (InvocationExpressionSyntax *)0x0) {
      local_40 = (expr->sourceRange).startLoc;
      SStack_38 = (expr->sourceRange).endLoc;
      syntax = (InvocationExpressionSyntax *)0x0;
    }
    else {
      SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      local_40 = SVar4.startLoc;
      SStack_38 = SVar4.endLoc;
    }
    SVar4.endLoc = SStack_38;
    SVar4.startLoc = local_40;
    pEVar3 = createSystemCall((CallExpression *)compilation,compilation_00,(SystemSubroutine *)expr,
                              (Expression *)syntax,(InvocationExpressionSyntax *)withClause,
                              (ArrayOrRandomizeMethodExpressionSyntax *)context,SVar4,
                              (ASTContext *)0x0,in_stack_ffffffffffffffb0);
    return pEVar3;
  }
  if (syntax == (InvocationExpressionSyntax *)0x0) {
    pDVar2 = ASTContext::addDiag(context,(DiagCode)0x650007,selector->dotLocation);
    Diagnostic::operator<<(pDVar2,expr->sourceRange);
    Diagnostic::operator<<(pDVar2,selector->nameRange);
  }
  else {
    pDVar2 = ASTContext::addDiag(context,(DiagCode)0x3c000a,selector->nameRange);
    pDVar2 = Diagnostic::operator<<(pDVar2,selector->name);
  }
  ast::operator<<(pDVar2,(expr->type).ptr);
  pEVar3 = Expression::badExpr(compilation,expr);
  return pEVar3;
}

Assistant:

Expression& CallExpression::fromSystemMethod(
    Compilation& compilation, const Expression& expr, const LookupResult::MemberSelector& selector,
    const InvocationExpressionSyntax* syntax,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context) {

    const Type& type = expr.type->getCanonicalType();
    auto subroutine = compilation.getSystemMethod(type.kind, selector.name);
    if (!subroutine) {
        if (syntax) {
            context.addDiag(diag::UnknownSystemMethod, selector.nameRange)
                << selector.name << *expr.type;
        }
        else {
            auto& diag = context.addDiag(diag::InvalidMemberAccess, selector.dotLocation);
            diag << expr.sourceRange;
            diag << selector.nameRange;
            diag << *expr.type;
        }
        return badExpr(compilation, &expr);
    }

    return createSystemCall(compilation, *subroutine, &expr, syntax, withClause,
                            syntax ? syntax->sourceRange() : expr.sourceRange, context);
}